

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

string * __thiscall
duckdb::ART::GenerateConstraintErrorMessage
          (string *__return_storage_ptr__,ART *this,VerifyExistenceType verify_type,string *key_name
          )

{
  pointer pcVar1;
  int iVar2;
  NotImplementedException *this_00;
  string *psVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  _Alloc_hider _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  string type;
  string local_130;
  string local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar2 = (int)CONCAT71(in_register_00000011,verify_type);
  if (iVar2 == 2) {
    paVar6 = &local_e0;
    psVar3 = key_name;
    local_f0[0] = paVar6;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,
               "Violates foreign key constraint because key \"%s\" is still referenced by a foreign key in a different table. If this is an unexpected constraint violation, please refer to our foreign key limitations in the documentation"
               ,"");
    pcVar1 = (key_name->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + key_name->_M_string_length);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_f0,&local_110,psVar3);
    _Var5._M_p = (pointer)local_f0[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
      _Var5._M_p = (pointer)local_f0[0];
    }
  }
  else if (iVar2 == 1) {
    paVar6 = &local_a0;
    psVar3 = key_name;
    local_b0[0] = paVar6;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,
               "Violates foreign key constraint because key \"%s\" does not exist in the referenced table"
               ,"");
    pcVar1 = (key_name->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + key_name->_M_string_length);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_b0,&local_d0,psVar3);
    _Var5._M_p = (pointer)local_b0[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      _Var5._M_p = (pointer)local_b0[0];
    }
  }
  else {
    if (iVar2 != 0) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,"Type not implemented for VerifyExistenceType","");
      NotImplementedException::NotImplementedException(this_00,&local_130);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar2 = (*(this->super_BoundIndex).super_Index._vptr_Index[5])(this);
    bVar7 = (char)iVar2 == '\x02';
    pcVar4 = "unique";
    if (bVar7) {
      pcVar4 = "primary key";
    }
    paVar6 = &local_130.field_2;
    local_130._M_dataplus._M_p = (pointer)paVar6;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,pcVar4,pcVar4 + (ulong)bVar7 * 5 + 6);
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Duplicate key \"%s\" violates %s constraint.","");
    pcVar1 = (key_name->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + key_name->_M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_50,&local_70,&local_90,in_R8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    _Var5._M_p = local_130._M_dataplus._M_p;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
      _Var5._M_p = local_130._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ART::GenerateConstraintErrorMessage(VerifyExistenceType verify_type, const string &key_name) {
	switch (verify_type) {
	case VerifyExistenceType::APPEND: {
		// APPEND to PK/UNIQUE table, but node/key already exists in PK/UNIQUE table.
		string type = IsPrimary() ? "primary key" : "unique";
		return StringUtil::Format("Duplicate key \"%s\" violates %s constraint.", key_name, type);
	}
	case VerifyExistenceType::APPEND_FK: {
		// APPEND_FK to FK table, node/key does not exist in PK/UNIQUE table.
		return StringUtil::Format(
		    "Violates foreign key constraint because key \"%s\" does not exist in the referenced table", key_name);
	}
	case VerifyExistenceType::DELETE_FK: {
		// DELETE_FK that still exists in a FK table, i.e., not a valid delete.
		return StringUtil::Format(
		    "Violates foreign key constraint because key \"%s\" is still referenced by a foreign "
		    "key in a different table. If this is an unexpected constraint violation, please refer to our "
		    "foreign key limitations in the documentation",
		    key_name);
	}
	default:
		throw NotImplementedException("Type not implemented for VerifyExistenceType");
	}
}